

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

void __thiscall TestStream::seek(TestStream *this,int32_t pos,SeekType type)

{
  SeekType type_local;
  int32_t pos_local;
  TestStream *this_local;
  
  if (type == FromCurrent) {
    pos_local = this->m_pos + pos;
    if (pos_local < 0) {
      pos_local = this->m_size + pos_local;
    }
  }
  else if ((type == FromEnd) && (0 < pos)) {
    pos_local = this->m_size - pos;
  }
  else if ((type == FromEnd) && (pos < 0)) {
    pos_local = pos;
    if (pos < 1) {
      pos_local = -pos;
    }
  }
  else {
    pos_local = pos;
    if ((type == FromBeginning) && (pos_local = pos, pos < 0)) {
      pos_local = this->m_size - pos;
    }
  }
  if (pos_local < this->m_size) {
    this->m_pos = pos_local;
  }
  else {
    this->m_pos = this->m_size;
  }
  return;
}

Assistant:

void
TestStream::seek( int32_t pos, Excel::Stream::SeekType type )
{
	if( type == Excel::Stream::FromCurrent )
	{
		pos += m_pos;

		if( pos < 0 )
			pos += m_size;
	}
	else if( type == Excel::Stream::FromEnd && pos > 0 )
		pos = m_size - pos;
	else if( type == Excel::Stream::FromEnd && pos < 0 )
		pos = std::abs( pos );
	else if( type == Excel::Stream::FromBeginning && pos < 0 )
		pos = m_size - pos;

	if( pos >= m_size )
	{
		m_pos = m_size;
		return;
	}

	m_pos = pos;
}